

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

timestamp_t
duckdb::TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,interval_t offset)

{
  bool bVar1;
  long right;
  timestamp_t tVar2;
  long lVar3;
  long right_00;
  long left;
  interval_t iVar4;
  undefined1 auVar5 [16];
  timestamp_t result;
  timestamp_t local_60;
  string local_58;
  interval_t local_38;
  
  local_38.micros = bucket_width.micros;
  local_38._0_8_ = bucket_width._0_8_;
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(ts);
  if (bVar1) {
    right = duckdb::Interval::GetMicro(&local_38);
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts,&local_60,false);
    tVar2.value = local_60.value;
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)ts.value,(timestamp_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = (interval_t)duckdb::Interval::Invert(offset);
    tVar2.value = duckdb::Interval::Add(tVar2,iVar4);
    lVar3 = duckdb::Timestamp::GetEpochMicroSeconds(tVar2);
    right_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x35d2976e6a000)) % SEXT816(right),0);
    lVar3 = SubtractOperatorOverflowCheck::Operation<long,long,long>(lVar3,right_00);
    left = lVar3 - lVar3 % right;
    if (lVar3 % right != 0 && lVar3 < 0) {
      left = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,right);
    }
    tVar2.value = duckdb::Timestamp::FromEpochMicroSeconds(left + right_00);
    tVar2.value = duckdb::Interval::Add(tVar2,offset);
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (tVar2,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)tVar2.value,(timestamp_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)ts.value,(timestamp_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (timestamp_t)local_60.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(
			    Interval::Add(Cast::template Operation<TB, timestamp_t>(ts), Interval::Invert(offset)));
			return Cast::template Operation<timestamp_t, TR>(Interval::Add(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS), offset));
		}